

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

xmlRelaxNGParserCtxtPtr xmlRelaxNGNewDocParserCtxt(xmlDocPtr doc)

{
  xmlDocPtr cur;
  xmlRelaxNGParserCtxtPtr __s;
  void **ppvVar1;
  
  if ((doc != (xmlDocPtr)0x0) && (cur = xmlCopyDoc(doc,1), cur != (xmlDocPtr)0x0)) {
    __s = (xmlRelaxNGParserCtxtPtr)(*xmlMalloc)(0x100);
    if (__s != (xmlRelaxNGParserCtxtPtr)0x0) {
      memset(__s,0,0x100);
      __s->document = cur;
      __s->freedoc = 1;
      ppvVar1 = __xmlGenericErrorContext();
      __s->userData = *ppvVar1;
      return __s;
    }
    xmlRngPErrMemory((xmlRelaxNGParserCtxtPtr)0x0,"building parser\n");
    xmlFreeDoc(cur);
    return (xmlRelaxNGParserCtxtPtr)0x0;
  }
  return (xmlRelaxNGParserCtxtPtr)0x0;
}

Assistant:

xmlRelaxNGParserCtxtPtr
xmlRelaxNGNewDocParserCtxt(xmlDocPtr doc)
{
    xmlRelaxNGParserCtxtPtr ret;
    xmlDocPtr copy;

    if (doc == NULL)
        return (NULL);
    copy = xmlCopyDoc(doc, 1);
    if (copy == NULL)
        return (NULL);

    ret =
        (xmlRelaxNGParserCtxtPtr) xmlMalloc(sizeof(xmlRelaxNGParserCtxt));
    if (ret == NULL) {
        xmlRngPErrMemory(NULL, "building parser\n");
        xmlFreeDoc(copy);
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlRelaxNGParserCtxt));
    ret->document = copy;
    ret->freedoc = 1;
    ret->userData = xmlGenericErrorContext;
    return (ret);
}